

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall
sfc::Subpalette::add(Subpalette *this,rgba_vec_t *new_colors,bool add_duplicates,bool overwrite)

{
  bool bVar1;
  reference puVar2;
  const_iterator cStack_38;
  uint c;
  const_iterator __end1;
  const_iterator __begin1;
  rgba_vec_t *__range1;
  bool overwrite_local;
  bool add_duplicates_local;
  rgba_vec_t *new_colors_local;
  Subpalette *this_local;
  
  if (overwrite) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->_colors);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              (&this->_colors_set);
  }
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(new_colors);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(new_colors);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      (&__end1,&stack0xffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    add(this,*puVar2,add_duplicates);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Subpalette::add(const rgba_vec_t& new_colors, bool add_duplicates, bool overwrite) {
  if (overwrite) {
    _colors.clear();
    _colors_set.clear();
  }
  for (auto c : new_colors)
    add(c, add_duplicates);
}